

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

int __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get_codepoint(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                *this)

{
  int iVar1;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_00;
  byte bVar2;
  initializer_list<int> *in_RDI;
  int factor;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<int> *__range3;
  initializer_list<int> factors;
  int codepoint;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *local_48;
  int local_38 [4];
  initializer_list<int> local_28;
  int local_14;
  
  local_14 = 0;
  local_38[0] = 0xc;
  local_38[1] = 8;
  local_38[2] = 4;
  local_38[3] = 0;
  local_28._M_array = local_38;
  local_28._M_len = 4;
  local_48 = (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *)std::initializer_list<int>::begin(&local_28);
  this_00 = (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *)std::initializer_list<int>::end(in_RDI);
  do {
    if (local_48 == this_00) {
      return local_14;
    }
    iVar1 = *(int *)&(local_48->ia).
                     super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
    get(this_00);
    bVar2 = (byte)iVar1;
    if ((*(int *)&in_RDI[1]._M_array < 0x30) || (0x39 < *(int *)&in_RDI[1]._M_array)) {
      if ((*(int *)&in_RDI[1]._M_array < 0x41) || (0x46 < *(int *)&in_RDI[1]._M_array)) {
        if ((*(int *)&in_RDI[1]._M_array < 0x61) || (0x66 < *(int *)&in_RDI[1]._M_array)) {
          return -1;
        }
        iVar1 = *(int *)&in_RDI[1]._M_array + -0x57 << (bVar2 & 0x1f);
      }
      else {
        iVar1 = *(int *)&in_RDI[1]._M_array + -0x37 << (bVar2 & 0x1f);
      }
    }
    else {
      iVar1 = *(int *)&in_RDI[1]._M_array + -0x30 << (bVar2 & 0x1f);
    }
    local_14 = iVar1 + local_14;
    local_48 = (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                *)((long)&(local_48->ia).
                          super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 4);
  } while( true );
}

Assistant:

int get_codepoint()
{
// this function only makes sense after reading `\u`
assert(current == 'u');
int codepoint = 0;

const auto factors = { 12, 8, 4, 0 };
for (const auto factor : factors)
{
get();

if (current >= '0' and current <= '9')
{
codepoint += ((current - 0x30) << factor);
}
else if (current >= 'A' and current <= 'F')
{
codepoint += ((current - 0x37) << factor);
}
else if (current >= 'a' and current <= 'f')
{
codepoint += ((current - 0x57) << factor);
}
else
{
return -1;
}
}

assert(0x0000 <= codepoint and codepoint <= 0xFFFF);
return codepoint;
}